

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-attack.c
# Opt level: O0

_Bool summon_possible(loc_conflict grid)

{
  _Bool _Var1;
  wchar_t wVar2;
  loc_conflict grid_00;
  loc_conflict near;
  wchar_t x;
  wchar_t y;
  loc_conflict grid_local;
  
  if ((player->upkeep->arena_level & 1U) == 0) {
    y = grid.y;
    for (near.y = y + L'\xfffffffe'; near.y <= y + L'\x02'; near.y = near.y + L'\x01') {
      x = grid.x;
      for (near.x = x + L'\xfffffffe'; near.x <= x + L'\x02'; near.x = near.x + L'\x01') {
        grid_00 = (loc_conflict)loc(near.x,near.y);
        _Var1 = square_in_bounds((chunk *)cave,grid_00);
        if ((((_Var1) && (wVar2 = distance((loc)grid,(loc)grid_00), wVar2 < L'\x03')) &&
            (_Var1 = square_iswarded((chunk *)cave,grid_00), !_Var1)) &&
           ((_Var1 = square_isempty((chunk *)cave,grid_00), _Var1 &&
            (_Var1 = los(cave,(loc)grid,(loc)grid_00), _Var1)))) {
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

static bool summon_possible(struct loc grid)
{
	int y, x;

	/* No summons in arenas */
	if (player->upkeep->arena_level) return false;

	/* Start at the location, and check 2 grids in each dir */
	for (y = grid.y - 2; y <= grid.y + 2; y++) {
		for (x = grid.x - 2; x <= grid.x + 2; x++) {
			struct loc near = loc(x, y);

			/* Ignore illegal locations */
			if (!square_in_bounds(cave, near)) continue;

			/* Only check a circular area */
			if (distance(grid, near) > 2) continue;

			/* Hack: no summon on glyph of warding */
			if (square_iswarded(cave, near)) continue;

			/* If it's empty floor grid in line of sight, we're good */
			if (square_isempty(cave, near) && los(cave, grid, near))
				return (true);
		}
	}

	return false;
}